

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasisFile(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  byte bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  byte in_R8B;
  ofstream file;
  long local_230 [64];
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  byte local_1;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::ofstream::ofstream(local_230,in_RSI,_S_out);
  bVar1 = std::ios::operator!((void *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  local_1 = (bVar1 & 1) == 0;
  if ((bool)local_1) {
    (**(code **)(*(long *)(in_RDI + 0x1f0) + 0x10))(in_RDI + 0x1f0,local_230,local_20,local_28,0);
  }
  std::ofstream::~ofstream(local_230);
  return (bool)(local_1 & 1);
}

Assistant:

bool SPxSolverBase<R>::writeBasisFile
(const char*    filename,
 const NameSet* rowNames,
 const NameSet* colNames,
 const bool cpxFormat) const
{
   std::ofstream file(filename);

   if(!file)
      return false;

   this->writeBasis(file, rowNames, colNames);
   return true;
}